

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  float fVar1;
  ImGuiWindow *root_payload;
  ImGuiTabBar *pIVar2;
  ImGuiContext *ctx;
  bool bVar3;
  bool is_explicit_target;
  int iVar4;
  ImGuiPayload *pIVar5;
  ImGuiDockNode *pIVar6;
  ImGuiDockNode *host_node;
  ImGuiDockNode *host_node_00;
  ImGuiDockPreviewData *pIVar7;
  ImRect explicit_target_rect;
  ImGuiDockPreviewData split_inner;
  ImGuiDockPreviewData split_outer;
  ImVec2 local_2a8;
  ImVec2 aIStack_2a0 [2];
  ImGuiDockPreviewData local_290;
  ImGuiDockPreviewData local_160;
  
  ctx = GImGui;
  if ((window->Flags & 0x200000) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x4295,"void ImGui::BeginDockableDragDropTarget(ImGuiWindow *)");
  }
  if (GImGui->DragDropActive != true) {
    return;
  }
  local_290.FutureNode.LocalFlags = (ImGuiDockNodeFlags)((window->Pos).x + (window->Size).x);
  local_290.FutureNode.LocalFlagsInWindows =
       (ImGuiDockNodeFlags)((window->Pos).y + (window->Size).y);
  local_290.FutureNode.ID = (ImGuiID)(window->Pos).x;
  local_290.FutureNode.SharedFlags = (ImGuiDockNodeFlags)(window->Pos).y;
  bVar3 = BeginDragDropTargetCustom((ImRect *)&local_290,window->ID);
  if (!bVar3) {
    return;
  }
  if ((((ctx->DragDropPayload).DataFrameCount == -1) ||
      (iVar4 = strcmp("_IMWINDOW",(ctx->DragDropPayload).DataType), iVar4 != 0)) ||
     (bVar3 = DockNodeIsDropAllowed(window,*(ctx->DragDropPayload).Data), !bVar3))
  goto LAB_001631e0;
  root_payload = *(ctx->DragDropPayload).Data;
  pIVar5 = AcceptDragDropPayload("_IMWINDOW",0xc00);
  if (pIVar5 == (ImGuiPayload *)0x0) goto LAB_001631e0;
  if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
    host_node = window->DockNode;
    bVar3 = host_node == (ImGuiDockNode *)0x0;
  }
  else {
    pIVar6 = DockNodeTreeFindVisibleNodeByPos(window->DockNodeAsHost,(ctx->IO).MousePos);
    if (pIVar6 == (ImGuiDockNode *)0x0) {
      host_node = (ImGuiDockNode *)0x0;
    }
    else {
      host_node = pIVar6;
      if (((pIVar6->MergedFlags & 0x400) != 0) && (pIVar6->ParentNode == (ImGuiDockNode *)0x0)) {
        host_node = pIVar6->CentralNode;
        if ((host_node != (ImGuiDockNode *)0x0) && (pIVar6->ChildNodes[0] == (ImGuiDockNode *)0x0))
        {
          bVar3 = false;
          goto LAB_00163010;
        }
        host_node = DockNodeTreeFindFallbackLeafNode(pIVar6);
      }
    }
    bVar3 = false;
  }
LAB_00163010:
  if (((host_node == (ImGuiDockNode *)0x0) ||
      (pIVar2 = host_node->TabBar, pIVar2 == (ImGuiTabBar *)0x0)) ||
     ((host_node->MergedFlags & 0x3000) != 0)) {
    fVar1 = (GImGui->Style).FramePadding.y;
    local_2a8 = window->Pos;
    aIStack_2a0[0].y = fVar1 + fVar1 + GImGui->FontSize + (window->Pos).y;
    aIStack_2a0[0].x = (window->Size).x + (window->Pos).x;
  }
  else {
    local_2a8 = (pIVar2->BarRect).Min;
    aIStack_2a0[0] = (pIVar2->BarRect).Max;
  }
  is_explicit_target = true;
  if ((ctx->IO).ConfigDockingWithShift == false) {
    is_explicit_target = IsMouseHoveringRect(&local_2a8,aIStack_2a0,true);
  }
  if ((((ctx->DragDropPayload).Preview != false) || ((ctx->DragDropPayload).Delivery == true)) &&
     ((bool)(host_node != (ImGuiDockNode *)0x0 | bVar3))) {
    ImGuiDockPreviewData::ImGuiDockPreviewData(&local_290);
    ImGuiDockPreviewData::ImGuiDockPreviewData(&local_160);
    pIVar7 = &local_290;
    if ((host_node != (ImGuiDockNode *)0x0) &&
       ((pIVar6 = host_node, host_node->ParentNode != (ImGuiDockNode *)0x0 ||
        ((host_node->MergedFlags & 0x800) != 0)))) {
      do {
        host_node_00 = pIVar6;
        pIVar6 = host_node_00->ParentNode;
      } while (pIVar6 != (ImGuiDockNode *)0x0);
      DockNodePreviewDockSetup(window,host_node_00,root_payload,&local_160,is_explicit_target,true);
      pIVar7 = &local_290;
      if (local_160.IsSplitDirExplicit != false) {
        pIVar7 = &local_160;
      }
    }
    DockNodePreviewDockSetup(window,host_node,root_payload,&local_290,is_explicit_target,false);
    if (pIVar7 == &local_160) {
      local_290.IsDropAllowed = false;
    }
    DockNodePreviewDockRender(window,host_node,root_payload,&local_290);
    DockNodePreviewDockRender(window,host_node,root_payload,&local_160);
    if ((pIVar7->IsDropAllowed == true) && ((ctx->DragDropPayload).Delivery == true)) {
      DockContextQueueDock
                (ctx,window,pIVar7->SplitNode,root_payload,pIVar7->SplitDir,pIVar7->SplitRatio,
                 pIVar7 == &local_160);
    }
    ImGuiDockNode::~ImGuiDockNode(&local_160.FutureNode);
    ImGuiDockNode::~ImGuiDockNode(&local_290.FutureNode);
  }
LAB_001631e0:
  EndDragDropTarget();
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindowDockTree == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    //GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        // (Important: we cannot use g.HoveredDockNode here! Because each of our target node have filters based on payload, each candidate drop target will do its own evaluation)
        bool dock_into_floating_window = false;
        ImGuiDockNode* node = NULL;
        if (window->DockNodeAsHost)
        {
            // Cannot assume that node will != NULL even though we passed the rectangle test: it depends on padding/spacing handled by DockNodeTreeFindVisibleNodeByPos().
            node = DockNodeTreeFindVisibleNodeByPos(window->DockNodeAsHost, g.IO.MousePos);

            // There is an edge case when docking into a dockspace which only has _inactive_ nodes (because none of the windows are active)
            // In this case we need to fallback into any leaf mode, possibly the central node.
            // FIXME-20181220: We should not have to test for IsLeafNode() here but we have another bug to fix first.
            if (node && node->IsDockSpace() && node->IsRootNode())
                node = (node->CentralNode && node->IsLeafNode()) ? node->CentralNode : DockNodeTreeFindFallbackLeafNode(node);
        }
        else
        {
            if (window->DockNode)
                node = window->DockNode;
            else
                dock_into_floating_window = true; // Dock into a regular window
        }

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || dock_into_floating_window))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}